

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.cpp
# Opt level: O1

double __thiscall IntVar::getScore(IntVar *this,VarBranch vb)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  undefined8 *puVar5;
  Tchar *pTVar6;
  int iVar7;
  undefined4 uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  IntVar *pIVar12;
  Tchar *pTVar13;
  long lVar14;
  longdouble in_ST0;
  double dVar15;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  TrailElem TStack_58;
  IntVar *pIStack_48;
  
  uVar11 = (ulong)(vb - VAR_SIZE_MIN);
  if (0xc < vb - VAR_SIZE_MIN) {
switchD_00138680_caseD_9:
    getScore();
    if ((((this->sbps_value_selection == true) &&
         (uVar9 = this->last_solution_value, (this->min).v <= (int)uVar9)) &&
        ((int)uVar9 <= (this->max).v)) &&
       ((this->vals == (Tchar *)0x0 || (this->vals[(int)uVar9].v != '\0')))) {
LAB_00138885:
      puVar5 = (undefined8 *)operator_new(0x10);
      dVar15 = extraout_XMM0_Qa_03;
      goto LAB_0013888f;
    }
    pIVar12 = this;
    switch(this->preferred_val) {
    case PV_MIN:
      puVar5 = (undefined8 *)operator_new(0x10);
      uVar9 = (this->min).v;
      dVar15 = extraout_XMM0_Qa;
      break;
    case PV_MAX:
      puVar5 = (undefined8 *)operator_new(0x10);
      uVar9 = (this->max).v;
      dVar15 = extraout_XMM0_Qa_02;
      break;
    case PV_SPLIT_MIN:
      puVar5 = (undefined8 *)operator_new(0x10);
      uVar9 = (this->min).v;
      uVar9 = (int)(~uVar9 + (this->max).v) / 2 + uVar9;
      uVar8 = 3;
      dVar15 = extraout_XMM0_Qa_00;
      goto LAB_00138894;
    case PV_SPLIT_MAX:
      puVar5 = (undefined8 *)operator_new(0x10);
      iVar7 = (this->min).v;
      uVar9 = ((this->max).v - iVar7) / 2 + iVar7;
      uVar8 = 2;
      dVar15 = extraout_XMM0_Qa_01;
      goto LAB_00138894;
    case PV_MEDIAN:
      pTVar6 = this->vals;
      if (pTVar6 == (Tchar *)0x0) {
        branch();
        goto switchD_0013877a_default;
      }
      uVar9 = (this->min).v;
      uVar1 = (this->max).v;
      iVar7 = 1;
      if (uVar9 != uVar1) {
        iVar7 = 2;
        if ((int)((long)(int)uVar9 + 1) < (int)uVar1) {
          iVar7 = 2;
          lVar14 = 0;
          do {
            iVar7 = iVar7 + pTVar6[lVar14 + (long)(int)uVar9 + 1].v;
            lVar14 = lVar14 + 1;
          } while (~uVar9 + uVar1 != (int)lVar14);
        }
      }
      if (2 < iVar7) {
        iVar10 = (iVar7 - (iVar7 + -1 >> 0x1f)) + -1 >> 1;
        iVar7 = 1;
        if (1 < iVar10) {
          iVar7 = iVar10;
        }
        iVar10 = 0;
        do {
          uVar4 = 0x80000000;
          if (uVar9 != uVar1) {
            pTVar13 = pTVar6 + (long)(int)uVar9 + 1;
            do {
              uVar9 = uVar9 + 1;
              pcVar3 = &pTVar13->v;
              pTVar13 = pTVar13 + 1;
              uVar4 = uVar9;
            } while (*pcVar3 == '\0');
          }
          uVar9 = uVar4;
          iVar10 = iVar10 + 1;
        } while (iVar10 != iVar7);
      }
      goto LAB_00138885;
    default:
switchD_0013877a_default:
      branch();
      dVar15 = extraout_XMM0_Qa_04;
      if ((long)uVar11 <= (long)(pIVar12->max).v) {
        TStack_58.x = (pIVar12->min).v;
        TStack_58.sz = 4;
        TStack_58.pt = &(pIVar12->min).v;
        pIStack_48 = this;
        vec<TrailElem>::push(&engine.trail,&TStack_58);
        iVar7 = (int)uVar11;
        (pIVar12->min).v = iVar7;
        *(byte *)&pIVar12->changes = (byte)pIVar12->changes | 3;
        pTVar6 = pIVar12->vals;
        dVar15 = extraout_XMM0_Qa_05;
        if ((pTVar6 != (Tchar *)0x0) && (pTVar6[iVar7].v == '\0')) {
          iVar10 = iVar7 + -1;
          pTVar6 = pTVar6 + iVar7;
          do {
            iVar10 = iVar10 + 1;
            pcVar3 = &pTVar6->v;
            pTVar6 = pTVar6 + 1;
          } while (*pcVar3 == '\0');
          TStack_58.sz = 4;
          TStack_58.pt = &(pIVar12->min).v;
          TStack_58.x = iVar7;
          vec<TrailElem>::push(&engine.trail,&TStack_58);
          (pIVar12->min).v = iVar10;
          *(byte *)&pIVar12->changes = (byte)pIVar12->changes | 3;
          dVar15 = extraout_XMM0_Qa_06;
        }
        if ((pIVar12->min).v == (pIVar12->max).v) {
          *(byte *)&pIVar12->changes = (byte)pIVar12->changes | 8;
        }
        if (pIVar12->in_queue == false) {
          pIVar12->in_queue = true;
          TStack_58.pt = (int *)pIVar12;
          vec<IntVar_*>::push(&engine.v_queue,(IntVar **)&TStack_58);
          dVar15 = extraout_XMM0_Qa_07;
        }
      }
      return dVar15;
    }
LAB_0013888f:
    uVar8 = 1;
LAB_00138894:
    *puVar5 = this;
    *(uint *)(puVar5 + 1) = uVar9;
    *(undefined4 *)((long)puVar5 + 0xc) = uVar8;
    return dVar15;
  }
  switch(uVar11) {
  case 0:
    iVar7 = (this->min).v;
    goto LAB_001386dd;
  case 1:
    iVar7 = (this->max).v;
    goto LAB_00138701;
  case 2:
    iVar7 = 0;
LAB_00138701:
    iVar7 = iVar7 - (this->min).v;
    goto LAB_00138704;
  case 3:
    dVar15 = (double)(this->min).v;
    break;
  case 4:
    iVar7 = 0;
LAB_001386dd:
    iVar7 = iVar7 - (this->max).v;
LAB_00138704:
    dVar15 = (double)iVar7;
    break;
  case 5:
    dVar15 = (double)(this->max).v;
    break;
  case 6:
    dVar15 = (double)((ulong)(double)(this->pinfo).sz | (ulong)DAT_001dacf0);
    break;
  case 7:
    dVar15 = (double)(this->pinfo).sz;
    break;
  case 8:
    iVar7 = (this->min).v;
    dVar15 = 0.0;
    if (iVar7 != (this->max).v) {
      if (this->vals == (Tchar *)0x0) {
        dVar15 = 1.0;
      }
      else {
        lVar14 = 0;
        do {
          lVar2 = lVar14 + (long)iVar7 + 1;
          lVar14 = lVar14 + 1;
        } while (this->vals[lVar2].v == '\0');
        dVar15 = (double)(int)lVar14;
      }
    }
    break;
  default:
    goto switchD_00138680_caseD_9;
  case 10:
    MIP::getRC((longdouble *)mip,(MIP *)this,
               (IntVar *)
               ((long)&switchD_00138680::switchdataD_001dad00 +
               (long)(int)(&switchD_00138680::switchdataD_001dad00)[uVar11]));
    dVar15 = (double)in_ST0;
    break;
  case 0xc:
    dVar15 = this->activity;
  }
  return dVar15;
}

Assistant:

double IntVar::getScore(VarBranch vb) {
	switch (vb) {
		case VAR_MIN_MIN:
			return -min;
		case VAR_MIN_MAX:
			return min;
		case VAR_MAX_MIN:
			return -max;
		case VAR_MAX_MAX:
			return max;
#if INT_BRANCH_HOLES
		// note slight inconsistency, if INT_BRANCH_HOLES=0 then we
		// use the domain size-1, same behaviour but more efficient?
		case VAR_SIZE_MIN:
			return vals ? -size() : min - (max + 1);
		case VAR_SIZE_MAX:
			return vals ? size() : max + 1 - min;
#else
		case VAR_SIZE_MIN:
			return min - max;
		case VAR_SIZE_MAX:
			return max - min;
#endif
		case VAR_DEGREE_MIN:
			return -static_cast<double>(pinfo.size());
		case VAR_DEGREE_MAX:
			return pinfo.size();
		case VAR_REDUCED_COST:
			return mip->getRC(this);
		case VAR_ACTIVITY:
			return activity;
		case VAR_REGRET_MIN_MAX:
			return isFixed() ? 0 : (vals != nullptr ? *++begin() - *begin() : 1);
#ifdef HAS_VAR_IMPACT
		case VAR_IMPACT:
			return isFixed() ? 0 : impact;
#endif

		default:
			NOT_SUPPORTED;
	}
}